

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_data.h
# Opt level: O1

string * __thiscall
version_struct::to_string_abi_cxx11_(string *__return_storage_ptr__,version_struct *this)

{
  size_t sVar1;
  char v_str [128];
  char acStack_98 [136];
  
  snprintf(acStack_98,0x80,"%d.%d.%d",(ulong)(uint)this->major,(ulong)(uint)this->minor,
           (ulong)(uint)this->rev);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  sVar1 = strlen(acStack_98);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,acStack_98,acStack_98 + sVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string() const
  {
    char v_str[128];
    sprintf_s(v_str, sizeof(v_str), "%d.%d.%d", major, minor, rev);
    std::string s = v_str;
    return s;
  }